

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O2

void __thiscall md::ROM::extend(ROM *this,size_t new_size)

{
  int iVar1;
  int iVar2;
  ulong in_RAX;
  undefined8 uStack_28;
  
  iVar1 = *(int *)&(this->_byte_array).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this->_byte_array).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_byte_array,new_size,(value_type_conflict *)((long)&uStack_28 + 7));
  uStack_28._0_7_ = (uint7)(uint6)uStack_28;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_original_byte_array,new_size,(value_type_conflict *)((long)&uStack_28 + 6));
  mark_empty_chunk(this,iVar1 - iVar2,(uint32_t)new_size);
  set_long(this,0x1a4,(uint32_t)new_size - 1);
  return;
}

Assistant:

void ROM::extend(size_t new_size)
{
    size_t old_size = _byte_array.size();
    _byte_array.resize(new_size, 0);
    _original_byte_array.resize(new_size, 0);
    this->mark_empty_chunk(old_size, new_size);

    this->set_long(0x1A4, new_size-1);
}